

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_add_rel_pos(ggml_compute_params *params,ggml_tensor *dst)

{
  float fVar1;
  float fVar2;
  int iVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  size_t __n;
  long lVar12;
  long lVar13;
  float *pfVar14;
  int64_t j;
  long lVar15;
  long lVar16;
  float *pfVar17;
  long lVar18;
  float *pfVar19;
  float *pfVar20;
  long local_78;
  float *local_70;
  long local_60;
  float *local_58;
  
  if (dst->src[0]->type == GGML_TYPE_F32) {
    pgVar4 = dst->src[1];
    pgVar5 = dst->src[2];
    if (dst->op_params[0] == 0) {
      if (params->ith == 0) {
        pvVar6 = dst->data;
        pvVar7 = dst->src[0]->data;
        __n = ggml_nbytes(dst);
        memcpy(pvVar6,pvVar7,__n);
      }
      ggml_barrier(params->threadpool);
    }
    iVar3 = (int)pgVar4->ne[3];
    iVar11 = (iVar3 + -1 + params->nth) / params->nth;
    local_78 = (long)params->ith * (long)iVar11;
    iVar11 = iVar11 + (int)local_78;
    if (iVar3 <= iVar11) {
      iVar11 = iVar3;
    }
    if ((int)local_78 < iVar11) {
      pvVar6 = pgVar4->data;
      pvVar7 = pgVar5->data;
      lVar8 = pgVar4->ne[0];
      lVar9 = pgVar4->ne[1];
      lVar10 = pgVar4->ne[2];
      lVar18 = lVar9 * lVar8 * lVar8;
      lVar13 = lVar18 * lVar10;
      local_70 = (float *)((long)dst->data + lVar13 * local_78 * 4);
      do {
        if (0 < lVar10) {
          local_58 = local_70;
          local_60 = 0;
          do {
            if (0 < lVar9) {
              lVar12 = 0;
              pfVar17 = local_58;
              do {
                if (0 < lVar8) {
                  lVar16 = 0;
                  pfVar19 = pfVar17;
                  pfVar20 = pfVar17;
                  do {
                    lVar15 = lVar16 + (lVar12 + (local_60 + local_78 * lVar10) * lVar9) * lVar8;
                    fVar1 = *(float *)((long)pvVar6 + lVar15 * 4);
                    fVar2 = *(float *)((long)pvVar7 + lVar15 * 4);
                    lVar15 = 0;
                    pfVar14 = pfVar19;
                    do {
                      pfVar20[lVar15] = fVar2 + pfVar20[lVar15];
                      *pfVar14 = fVar1 + *pfVar14;
                      lVar15 = lVar15 + 1;
                      pfVar14 = pfVar14 + lVar8;
                    } while (lVar8 != lVar15);
                    lVar16 = lVar16 + 1;
                    pfVar19 = pfVar19 + 1;
                    pfVar20 = pfVar20 + lVar8;
                  } while (lVar16 != lVar8);
                }
                lVar12 = lVar12 + 1;
                pfVar17 = pfVar17 + lVar8 * lVar8;
              } while (lVar12 != lVar9);
            }
            local_60 = local_60 + 1;
            local_58 = local_58 + lVar18;
          } while (local_60 != lVar10);
        }
        local_78 = local_78 + 1;
        local_70 = local_70 + lVar13;
      } while (local_78 != iVar11);
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,0x1eeb,"fatal error");
}

Assistant:

void ggml_compute_forward_add_rel_pos(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_add_rel_pos_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}